

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O2

bool __thiscall
Parameter<std::vector<double,_std::allocator<double>_>_>::setData
          (Parameter<std::vector<double,_std::allocator<double>_>_> *this,
          vector<double,_std::allocator<double>_> *pval)

{
  bool bVar1;
  _Vector_base<double,_std::allocator<double>_> _Stack_28;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&_Stack_28,pval);
  bVar1 = Parameter<std::vector<double,std::allocator<double>>>::
          internalSetData<std::vector<double,std::allocator<double>>>
                    ((Parameter<std::vector<double,std::allocator<double>>> *)this,
                     (vector<double,_std::allocator<double>_> *)&_Stack_28);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_28);
  return bVar1;
}

Assistant:

virtual bool setData(std::vector<RealType> pval) {
    return internalSetData<std::vector<RealType>>(pval);
  }